

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_14::NameApplier::UseNameForVar(NameApplier *this,string_view name,Var *var)

{
  string_view name_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __x;
  NameApplier *pNVar1;
  size_t sVar2;
  bool bVar3;
  string *this_00;
  Var *var_local;
  NameApplier *this_local;
  string_view name_local;
  
  name_local._M_len = (size_t)name._M_str;
  this_local = (NameApplier *)name._M_len;
  bVar3 = Var::is_name(var);
  sVar2 = name_local._M_len;
  pNVar1 = this_local;
  if (bVar3) {
    this_00 = Var::name_abi_cxx11_(var);
    __y = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
          std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    __x._M_str = (char *)sVar2;
    __x._M_len = (size_t)pNVar1;
    bVar3 = std::operator==(__x,__y);
    if (!bVar3) {
      __assert_fail("name == var->name()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/apply-names.cc"
                    ,0x8f,
                    "void wabt::(anonymous namespace)::NameApplier::UseNameForVar(std::string_view, Var *)"
                   );
    }
  }
  else {
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
    if (!bVar3) {
      name_00._M_str = (char *)name_local._M_len;
      name_00._M_len = (size_t)this_local;
      Var::set_name(var,name_00);
    }
  }
  return;
}

Assistant:

void NameApplier::UseNameForVar(std::string_view name, Var* var) {
  if (var->is_name()) {
    assert(name == var->name());
    return;
  }

  if (!name.empty()) {
    var->set_name(name);
  }
}